

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

void vkt::tessellation::requireFeatures
               (InstanceInterface *vki,VkPhysicalDevice physDevice,FeatureFlags flags)

{
  NotSupportedError *pNVar1;
  VkPhysicalDeviceFeatures features;
  string local_120;
  VkPhysicalDeviceFeatures local_fc;
  
  ::vk::getPhysicalDeviceFeatures(&local_fc,vki,physDevice);
  if (((flags & 1) != 0) && (local_fc.tessellationShader == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Tessellation shader not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((flags & 2) != 0) && (local_fc.geometryShader == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Geometry shader not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((flags & 4) != 0) && (local_fc.shaderFloat64 == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Double-precision floats not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((flags & 8) != 0) && (local_fc.vertexPipelineStoresAndAtomics == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"SSBO and image writes not supported in vertex pipeline","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((flags & 0x10) != 0) && (local_fc.fragmentStoresAndAtomics == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"SSBO and image writes not supported in fragment shader","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((flags & 0x20) != 0) && (local_fc.shaderTessellationAndGeometryPointSize == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,
               "Tessellation and geometry shaders don\'t support PointSize built-in","");
    tcu::NotSupportedError::NotSupportedError(pNVar1,&local_120);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  return;
}

Assistant:

void requireFeatures (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const FeatureFlags flags)
{
	const VkPhysicalDeviceFeatures features = getPhysicalDeviceFeatures(vki, physDevice);

	if (((flags & FEATURE_TESSELLATION_SHADER) != 0) && !features.tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader not supported");

	if (((flags & FEATURE_GEOMETRY_SHADER) != 0) && !features.geometryShader)
		throw tcu::NotSupportedError("Geometry shader not supported");

	if (((flags & FEATURE_SHADER_FLOAT_64) != 0) && !features.shaderFloat64)
		throw tcu::NotSupportedError("Double-precision floats not supported");

	if (((flags & FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS) != 0) && !features.vertexPipelineStoresAndAtomics)
		throw tcu::NotSupportedError("SSBO and image writes not supported in vertex pipeline");

	if (((flags & FEATURE_FRAGMENT_STORES_AND_ATOMICS) != 0) && !features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("SSBO and image writes not supported in fragment shader");

	if (((flags & FEATURE_SHADER_TESSELLATION_AND_GEOMETRY_POINT_SIZE) != 0) && !features.shaderTessellationAndGeometryPointSize)
		throw tcu::NotSupportedError("Tessellation and geometry shaders don't support PointSize built-in");
}